

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall addrman_tests::addrman_ports::test_method(addrman_ports *this)

{
  __single_object _Var1;
  bool bVar2;
  int32_t consistency_check_ratio;
  int iVar3;
  int iVar4;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  time_point tVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l;
  const_string file_01;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar8;
  undefined1 local_3c8 [8];
  element_type *local_3c0;
  shared_count sStack_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  __single_object addrman;
  char *local_270;
  assertion_result local_268;
  char **local_250;
  string *local_248;
  char **local_240;
  char *local_238;
  assertion_result local_230;
  string local_218;
  undefined1 local_1f8 [16];
  undefined1 auStack_1e8 [16];
  uint16_t local_1d8;
  duration local_1d0;
  ServiceFlags SStack_1c8;
  direct_or_indirect local_1c0;
  uint local_1b0;
  Network local_1a8;
  uint32_t uStack_1a4;
  uint16_t local_1a0;
  string local_198;
  direct_or_indirect local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  uint16_t local_158;
  NodeSeconds local_150;
  ServiceFlags SStack_148;
  direct_or_indirect local_138;
  undefined1 *local_128;
  string *local_120;
  uint16_t local_118;
  duration local_110;
  ServiceFlags SStack_108;
  direct_or_indirect local_f8;
  uint local_e8;
  Network local_e0;
  uint32_t uStack_dc;
  uint16_t local_d8;
  direct_or_indirect local_d0;
  shared_count asStack_c0 [2];
  uint16_t local_b0;
  direct_or_indirect local_a8;
  uint local_98;
  undefined8 local_90;
  uint16_t local_88;
  direct_or_indirect local_80;
  shared_count sStack_70;
  undefined8 local_68;
  uint16_t local_60;
  direct_or_indirect local_58;
  uint local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio =
       GetCheckRatio((NodeContext *)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  local_178.indirect_contents.indirect = (char *)&local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,(string *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.indirect_contents.indirect != &local_168) {
    operator_delete(local_178.indirect_contents.indirect,
                    (ulong)(local_168._M_allocated_capacity + 1));
  }
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x73;
  file.m_begin = (iterator)&local_288;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_013ae088;
  auStack_1e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_1e8._8_8_ = "";
  local_3c8 = (undefined1  [8])
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_198._M_dataplus._M_p = (pointer)&local_218;
  local_218._M_dataplus._M_p = (pointer)((ulong)local_218._M_dataplus._M_p._4_4_ << 0x20);
  local_80.direct[0] = local_3c8 == (undefined1  [8])0x0;
  local_80._8_8_ = 0;
  sStack_70.pi_ = (sp_counted_base *)0x0;
  local_d0.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_d0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x5f;
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_198;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae108;
  local_128 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_268._0_8_ = (pointer)local_3c8;
  local_168._8_8_ = &local_268;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_80.indirect_contents,(lazy_ostream *)local_1f8,1,2,REQUIRE,
             0xe59af2,(size_t)&local_d0,0x73,(string *)&local_178,"0U",&local_138);
  boost::detail::shared_count::~shared_count(&sStack_70);
  local_178.indirect_contents.indirect = (char *)&local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"250.1.1.1","");
  ResolveService((CService *)&local_80.indirect_contents,(string *)&local_178,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.indirect_contents.indirect != &local_168) {
    operator_delete(local_178.indirect_contents.indirect,
                    (ulong)(local_168._M_allocated_capacity + 1));
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x77;
  file_00.m_begin = (iterator)&local_2a8;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2b8,
             msg_00);
  _Var1 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_80.indirect_contents);
  local_90 = local_68;
  local_88 = local_60;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8.indirect_contents);
  local_168._8_8_ = local_90;
  local_158 = local_88;
  local_150.__d.__r = (duration)100000000;
  SStack_148 = NODE_NONE;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_178;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_d0,__l,
             (allocator_type *)&local_198);
  _cVar8 = 0x21cf8c;
  bVar2 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_d0,
                       (CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
  local_1f8[0] = bVar2;
  local_1f8._8_8_ = (element_type *)0x0;
  auStack_1e8._0_8_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_268.m_message.px = (element_type *)0xe59b62;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2c0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_120 = (string *)&local_268;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&local_138,1,0,WARN,_cVar8,
             (size_t)&local_2c8,0x77);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_1e8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_d0);
  if (0x10 < (uint)local_168._M_allocated_capacity._0_4_) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_98) {
    free(local_a8.indirect_contents.indirect);
    local_a8.indirect_contents.indirect = (char *)0x0;
  }
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x78;
  file_01.m_begin = (iterator)&local_2d8;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2e8,
             msg_01);
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_013ae088;
  auStack_1e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_1e8._8_8_ = "";
  local_218._M_dataplus._M_p =
       (pointer)AddrMan::Size((AddrMan *)
                              addrman._M_t.
                              super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                              super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                              super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                              (optional<Network>)0x0,(optional<bool>)0x0);
  local_3c8 = (undefined1  [8])&local_230;
  local_230._0_4_ = 1;
  local_d0.direct[0] = local_218._M_dataplus._M_p == (pointer)0x1;
  local_d0._8_8_ = (element_type *)0x0;
  asStack_c0[0].pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_268.m_message.px = (element_type *)0xe59ad8;
  local_198._M_dataplus._M_p = (pointer)&local_218;
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae108;
  local_128 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_168._8_8_ = &local_198;
  local_120 = (string *)local_3c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_d0,(lazy_ostream *)local_1f8,1,2,REQUIRE,0xe59af2,
             (size_t)&local_268,0x78,(iterator)&local_178,"1U",(lazy_ostream *)&local_138);
  boost::detail::shared_count::~shared_count(asStack_c0);
  local_178.indirect_contents.indirect = (char *)&local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"250.1.1.1","");
  ResolveService((CService *)&local_d0,(string *)&local_178,0x208e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.indirect_contents.indirect != &local_168) {
    operator_delete(local_178.indirect_contents.indirect,
                    (ulong)(local_168._M_allocated_capacity + 1));
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x7b;
  file_02.m_begin = (iterator)&local_2f8;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_308,
             msg_02);
  _Var1 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0);
  _local_e0 = asStack_c0[1].pi_;
  local_d8 = local_b0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  local_168._8_4_ = local_e0;
  local_168._12_4_ = uStack_dc;
  local_158 = local_d8;
  local_150.__d.__r = (duration)100000000;
  SStack_148 = NODE_NONE;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_178;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_268,__l_00,
             (allocator_type *)local_3c8);
  _cVar8 = 0x21d337;
  bVar2 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_268,
                       (CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
  local_1f8[0] = bVar2;
  local_1f8._8_8_ = (element_type *)0x0;
  auStack_1e8._0_8_ = (sp_counted_base *)0x0;
  local_198._M_dataplus._M_p = "addrman->Add({CAddress(addr1_port, NODE_NONE)}, source)";
  local_198._M_string_length = 0xe59c9f;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae1c8;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_310 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_120 = &local_198;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f8,(lazy_ostream *)&local_138,1,0,WARN,_cVar8,
             (size_t)&local_318,0x7b);
  boost::detail::shared_count::~shared_count((shared_count *)auStack_1e8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_268);
  if (0x10 < (uint)local_168._M_allocated_capacity._0_4_) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x7c;
  file_03.m_begin = (iterator)&local_328;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_338,
             msg_03);
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_013ae088;
  auStack_1e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_1e8._8_8_ = "";
  local_230._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                     (optional<bool>)0x0);
  local_218._M_dataplus._M_p = (pointer)&local_240;
  local_240 = (char **)CONCAT44(local_240._4_4_,2);
  local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((string **)local_230._0_8_ == (string **)0x2);
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_198._M_string_length = 0xe59ad8;
  local_3c8 = (undefined1  [8])&local_230;
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae108;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_218;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_168._8_8_ = (assertion_result *)local_3c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)local_1f8,1,2,REQUIRE,0xe59af2,(size_t)&local_198,0x7c,
             (iterator)&local_178,"2U",(lazy_ostream *)&local_138);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_178,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,(optional<Network>)0x0)
  ;
  local_138._9_7_ = local_178._9_7_;
  local_138._8_1_ = (bool)local_178.direct[8];
  local_138.indirect_contents.indirect = local_178.indirect_contents.indirect;
  local_128 = (undefined1 *)CONCAT44(local_128._4_4_,local_168._M_allocated_capacity._0_4_);
  local_120 = (string *)local_168._8_8_;
  local_118 = local_158;
  local_110 = local_150.__d.__r;
  SStack_108 = SStack_148;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x7e;
  file_04.m_begin = (iterator)&local_348;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_358,
             msg_04);
  CService::ToStringAddrPort_abi_cxx11_((string *)&local_178,(CService *)&local_138);
  _cVar8 = 0x21d660;
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178
                     ,"250.1.1.1:8333");
  if (iVar3 == 0) {
    bVar2 = true;
  }
  else {
    CService::ToStringAddrPort_abi_cxx11_(&local_198,(CService *)&local_138);
    _cVar8 = 0x21d692;
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_198,"250.1.1.1:8334");
    bVar2 = iVar4 == 0;
  }
  local_268.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_268.m_message.px = (element_type *)0x0;
  local_268.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3c8 = (undefined1  [8])0xe59caf;
  local_3c0 = (element_type *)0xe59d13;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  auStack_1e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_360 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  auStack_1e8._8_8_ = (assertion_result *)local_3c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_268,(lazy_ostream *)local_1f8,1,0,WARN,_cVar8,(size_t)&local_368,0x7e);
  boost::detail::shared_count::~shared_count(&local_268.m_message.pn);
  if ((iVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2)) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.indirect_contents.indirect != &local_168) {
    operator_delete(local_178.indirect_contents.indirect,
                    (ulong)(local_168._M_allocated_capacity + 1));
  }
  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0);
  _local_1a8 = asStack_c0[1].pi_;
  local_1a0 = local_b0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c0.indirect_contents);
  local_168._8_4_ = local_1a8;
  local_168._12_4_ = uStack_1a4;
  local_158 = local_1a0;
  local_150.__d.__r = (duration)100000000;
  SStack_148 = NODE_NONE;
  tVar5 = NodeClock::now();
  AddrMan::Good((AddrMan *)
                _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)&local_178,
                (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  if (0x10 < (uint)local_168._M_allocated_capacity._0_4_) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_1b0) {
    free(local_1c0.indirect_contents.indirect);
    local_1c0.indirect_contents.indirect = (char *)0x0;
  }
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x83;
  file_05.m_begin = (iterator)&local_378;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_388,
             msg_05);
  local_268.m_message.px = (element_type *)((ulong)local_268.m_message.px & 0xffffffffffffff00);
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_268.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_250 = (char **)0xf73bdc;
  local_248 = (string *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_270 = (char *)CONCAT44(local_270._4_4_,2);
  local_3c8[0] = local_248 == (string *)0x2;
  local_3c0 = (element_type *)0x0;
  sStack_3b8.pi_ = (sp_counted_base *)0x0;
  local_218._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_218._M_string_length = 0xe59ad8;
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_168._8_8_ = &local_230;
  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
  local_1f8._0_8_ = &PTR__lazy_ostream_013ae108;
  auStack_1e8._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_1e8._8_8_ = &local_240;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_240 = &local_270;
  local_230._0_8_ = &local_248;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3c8,(lazy_ostream *)&local_268,1,2,REQUIRE,0xe59af2,
             (size_t)&local_218,0x83,(CService *)&local_178,"2U",(lazy_ostream *)local_1f8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_3c8)->m_message + 8));
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_178,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,(optional<Network>)0x0);
  local_1f8._8_8_ = CONCAT71(local_178._9_7_,local_178.direct[8]);
  local_1f8._0_8_ = local_178.indirect_contents.indirect;
  auStack_1e8._0_4_ = local_168._M_allocated_capacity._0_4_;
  auStack_1e8._8_8_ = local_168._8_8_;
  local_1d8 = local_158;
  local_1d0 = local_150.__d.__r;
  SStack_1c8 = SStack_148;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x86;
  file_06.m_begin = (iterator)&local_398;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3a8,
             msg_06);
  local_3c0 = (element_type *)((ulong)local_3c0 & 0xffffffffffffff00);
  local_3c8 = (undefined1  [8])&PTR__lazy_ostream_013ae088;
  sStack_3b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3b0 = "";
  CService::ToStringAddrPort_abi_cxx11_(&local_218,(CService *)local_1f8);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_218,"250.1.1.1:8333");
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_240 = (char **)0xe59a79;
  local_238 = "";
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae148;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_270 = "250.1.1.1:8333";
  local_268.m_message.px = (element_type *)((ulong)local_268.m_message.px & 0xffffffffffffff00);
  local_268._0_8_ = &PTR__lazy_ostream_013ae208;
  local_268.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_250 = &local_270;
  local_248 = &local_218;
  local_168._8_8_ = &local_248;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)local_3c8,1,2,REQUIRE,0xe59d14,(size_t)&local_240,0x86,
             (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_178,"\"250.1.1.1:8333\"",&local_268);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (0x10 < (uint)auStack_1e8._0_4_) {
    free((void *)local_1f8._0_8_);
  }
  if (0x10 < (uint)local_128) {
    free(local_138.indirect_contents.indirect);
  }
  if (0x10 < (uint)asStack_c0[0].pi_) {
    free(local_d0.indirect_contents.indirect);
  }
  if (0x10 < (uint)sStack_70.pi_) {
    free((void *)CONCAT71(local_80._1_7_,local_80.direct[0]));
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_ports)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    BOOST_CHECK_EQUAL(addrman->Size(), 0U);

    // Test 7; Addr with same IP but diff port does not replace existing addr.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    CService addr1_port = ResolveService("250.1.1.1", 8334);
    BOOST_CHECK(addrman->Add({CAddress(addr1_port, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 2U);
    auto addr_ret2 = addrman->Select().first;
    BOOST_CHECK(addr_ret2.ToStringAddrPort() == "250.1.1.1:8333" || addr_ret2.ToStringAddrPort() == "250.1.1.1:8334");

    // Test: Add same IP but diff port to tried table; this converts the entry with
    // the specified port to tried, but not the other.
    addrman->Good(CAddress(addr1_port, NODE_NONE));
    BOOST_CHECK_EQUAL(addrman->Size(), 2U);
    bool new_only = true;
    auto addr_ret3 = addrman->Select(new_only).first;
    BOOST_CHECK_EQUAL(addr_ret3.ToStringAddrPort(), "250.1.1.1:8333");
}